

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  uint uVar6;
  ostream *poVar7;
  ostream *poVar8;
  long lVar9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar10;
  char *pcVar11;
  regmatch_t match;
  String error_message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90;
  char *local_70;
  long local_68;
  string local_60;
  void *local_40;
  long local_38;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream((internal *)&local_70,(CapturedStream **)&g_captured_stderr);
  Message::Message((Message *)&local_98);
  poVar7 = (ostream *)(local_98.ptr_ + 0x10);
  if (local_98.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar7 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Death test: ",0xc);
  pcVar11 = this->statement_;
  if (pcVar11 == (char *)0x0) {
    sVar10.ptr_ = local_98.ptr_ + 0x10;
    sVar4 = 6;
    pcVar11 = "(null)";
  }
  else {
    sVar10.ptr_ = local_98.ptr_;
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar10.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_98.ptr_ + 0x10);
    }
    sVar4 = strlen(pcVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar10.ptr_,pcVar11,sVar4);
  poVar7 = (ostream *)(local_98.ptr_ + 0x10);
  if (local_98.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar7 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      if ((this->regex_[8] == (RE)0x1) &&
         (iVar3 = regexec((regex_t *)(this->regex_ + 0x50),local_70,1,(regmatch_t *)&local_90,0),
         iVar3 == 0)) {
        bVar5 = true;
        goto LAB_0011ccf6;
      }
      poVar7 = (ostream *)(local_98.ptr_ + 0x10);
      if (local_98.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"    Result: died but not with expected error.\n",0x2e);
      poVar7 = (ostream *)(local_98.ptr_ + 0x10);
      if (local_98.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  Expected: ",0xc);
      pcVar11 = *(char **)this->regex_;
      if (pcVar11 == (char *)0x0) {
        sVar10.ptr_ = local_98.ptr_ + 0x10;
        sVar4 = 6;
        pcVar11 = "(null)";
      }
      else {
        sVar10.ptr_ = local_98.ptr_;
        if (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar10.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_98.ptr_ + 0x10);
        }
        sVar4 = strlen(pcVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar10.ptr_,pcVar11,sVar4);
      poVar7 = (ostream *)(local_98.ptr_ + 0x10);
      if (local_98.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      poVar7 = (ostream *)(local_98.ptr_ + 0x10);
      if (local_98.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Actual msg:\n",0xc);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,local_70,local_70 + local_68);
      FormatDeathTestOutput(&local_90,&local_60);
      poVar7 = (ostream *)(local_98.ptr_ + 0x10);
      if (local_98.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                         (char)local_90._M_dataplus._M_p),local_90._M_string_length)
      ;
      break;
    }
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    Result: died but not with expected exit code:\n",0x32);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"            ",0xc);
    uVar1 = this->status_;
    Message::Message((Message *)&local_90);
    uVar6 = uVar1 & 0x7f;
    if (uVar6 == 0) {
      poVar7 = (ostream *)
               (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) + 0x10);
      if (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) == 0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Exited with exit status ",0x18);
      poVar8 = (ostream *)
               (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) + 0x10);
      if (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) == 0) {
        poVar8 = (ostream *)0x0;
      }
      std::ostream::operator<<(poVar8,uVar1 >> 8 & 0xff);
    }
    else if (0x1ffffff < (int)(uVar6 * 0x1000000 + 0x1000000)) {
      poVar7 = (ostream *)
               (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) + 0x10);
      if (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) == 0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Terminated by signal ",0x15);
      poVar8 = (ostream *)
               (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) + 0x10);
      if (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) == 0) {
        poVar8 = (ostream *)0x0;
      }
      std::ostream::operator<<(poVar8,uVar6);
    }
    if ((char)uVar1 < '\0') {
      poVar7 = (ostream *)
               (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) + 0x10);
      if (CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) == 0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (core dumped)",0xe);
    }
    StringStreamToString
              ((internal *)&local_40,
               (stringstream *)
               CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p));
    if ((long *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p
                                    ) + 8))();
    }
    pvVar2 = local_40;
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    if (local_40 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(null)",6);
    }
    else if (local_38 != 0) {
      lVar9 = 0;
      do {
        if (*(char *)((long)pvVar2 + lVar9) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\0",2);
        }
        else {
          local_90._M_dataplus._M_p._0_1_ = *(char *)((long)pvVar2 + lVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_90,1);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != local_38);
    }
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Actual msg:\n",0xc);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_70,local_70 + local_68);
    FormatDeathTestOutput(&local_90,&local_60);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                       (char)local_90._M_dataplus._M_p),local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_40 != (void *)0x0) {
      operator_delete__(local_40);
    }
    goto LAB_0011ccf4;
  case LIVED:
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    Result: failed to die.\n",0x1b);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Error msg:\n",0xc);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_70,local_70 + local_68);
    FormatDeathTestOutput(&local_90,&local_60);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                       (char)local_90._M_dataplus._M_p),local_90._M_string_length);
    break;
  case RETURNED:
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    Result: illegal return in test statement.\n",0x2e);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Error msg:\n",0xc);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_70,local_70 + local_68);
    FormatDeathTestOutput(&local_90,&local_60);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                       (char)local_90._M_dataplus._M_p),local_90._M_string_length);
    break;
  case THREW:
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    Result: threw an exception.\n",0x20);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Error msg:\n",0xc);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_70,local_70 + local_68);
    FormatDeathTestOutput(&local_90,&local_60);
    poVar7 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                       (char)local_90._M_dataplus._M_p),local_90._M_string_length);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x213);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&local_90);
    goto LAB_0011ccf4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
LAB_0011ccf4:
  bVar5 = false;
LAB_0011ccf6:
  StringStreamToString((internal *)&local_90,local_98.ptr_);
  String::operator=((String *)&DeathTest::last_death_test_message_,(String *)&local_90);
  if ((void *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
      (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                       (char)local_90._M_dataplus._M_p));
  }
  if (local_98.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_98.ptr_ + 8))();
  }
  if (local_70 != (char *)0x0) {
    operator_delete__(local_70);
  }
  return bVar5;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const String error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}